

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O2

void duckdb_re2::CoalesceWalker::DoCoalesce(Regexp **r1ptr,Regexp **r2ptr)

{
  uint uVar1;
  Regexp *this;
  Regexp *this_00;
  int iVar2;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar3;
  Regexp *pRVar4;
  ostream *poVar5;
  Regexp *this_01;
  int iVar6;
  uint uVar7;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar8;
  long lVar9;
  ostringstream local_1a8 [376];
  
  this = *r1ptr;
  paVar8 = &this->field_5;
  paVar3 = paVar8;
  if (1 < this->nsub_) {
    paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
  }
  this_00 = *r2ptr;
  pRVar4 = Regexp::Incref(paVar3->subone_);
  pRVar4 = Regexp::Repeat(pRVar4,(uint)this->parse_flags_,0,0);
  switch(this->op_) {
  case '\a':
    *(int *)&pRVar4->arguments = -1;
    *(int *)((long)&pRVar4->arguments + 4) = 0;
    iVar6 = 0;
    goto LAB_0042346a;
  case '\b':
    *(int *)&pRVar4->arguments = -1;
    *(int *)((long)&pRVar4->arguments + 4) = 1;
    iVar6 = 1;
LAB_0042346a:
    iVar2 = -1;
    break;
  case '\t':
    iVar2 = 1;
    *(int *)&pRVar4->arguments = 1;
    *(int *)((long)&pRVar4->arguments + 4) = 0;
    iVar6 = 0;
    break;
  case '\n':
    iVar6 = (this->arguments).repeat.min_;
    (pRVar4->arguments).repeat.min_ = iVar6;
    iVar2 = (this->arguments).repeat.max_;
    (pRVar4->arguments).repeat.max_ = iVar2;
    break;
  default:
    Regexp::Decref(pRVar4);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar5 = std::operator<<((ostream *)local_1a8,"DoCoalesce failed: r1->op() is ");
    std::ostream::operator<<(poVar5,(uint)this->op_);
    goto LAB_004235b1;
  }
  switch(this_00->op_) {
  case '\x03':
  case '\f':
  case '\r':
  case '\x14':
    (pRVar4->arguments).repeat.min_ = iVar6 + 1;
  case '\t':
    if (iVar2 != -1) {
      iVar2 = iVar2 + 1;
LAB_0042349a:
      (pRVar4->arguments).repeat.max_ = iVar2;
    }
    break;
  case '\x04':
    if (1 < this->nsub_) {
      paVar8 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    uVar1 = (this_00->arguments).repeat.max_;
    uVar7 = 1;
    if (1 < (int)uVar1) {
      uVar7 = uVar1;
    }
    for (lVar9 = 1; lVar9 < (int)uVar1; lVar9 = lVar9 + 1) {
      if (*(int *)((long)&(((this_00->arguments).capture.name_)->_M_dataplus)._M_p + lVar9 * 4) !=
          (paVar8->subone_->arguments).repeat.max_) {
        uVar7 = (uint)lVar9;
        break;
      }
    }
    (pRVar4->arguments).repeat.min_ = iVar6 + uVar7;
    if (iVar2 != -1) {
      (pRVar4->arguments).repeat.max_ = iVar2 + uVar7;
    }
    if (uVar7 != (this_00->arguments).repeat.max_) {
      *r1ptr = pRVar4;
      pRVar4 = Regexp::LiteralString
                         ((Rune *)((long)&(((this_00->arguments).capture.name_)->_M_dataplus)._M_p +
                                  (ulong)uVar7 * 4),(this_00->arguments).repeat.max_ - uVar7,
                          (uint)this_00->parse_flags_);
      goto LAB_0042351f;
    }
    break;
  default:
    Regexp::Decref(pRVar4);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar5 = std::operator<<((ostream *)local_1a8,"DoCoalesce failed: r2->op() is ");
    std::ostream::operator<<(poVar5,(uint)this_00->op_);
LAB_004235b1:
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    return;
  case '\b':
    (pRVar4->arguments).repeat.min_ = iVar6 + 1;
  case '\a':
switchD_0042348b_caseD_7:
    (pRVar4->arguments).repeat.max_ = -1;
    break;
  case '\n':
    (pRVar4->arguments).repeat.min_ = iVar6 + (this_00->arguments).repeat.min_;
    iVar6 = (this_00->arguments).repeat.max_;
    if (iVar6 == -1) goto switchD_0042348b_caseD_7;
    if (iVar2 == -1) break;
    iVar2 = iVar2 + iVar6;
    goto LAB_0042349a;
  }
  this_01 = (Regexp *)operator_new(0x28);
  Regexp::Regexp(this_01,kRegexpEmptyMatch,NoParseFlags);
  *r1ptr = this_01;
LAB_0042351f:
  *r2ptr = pRVar4;
  Regexp::Decref(this);
  Regexp::Decref(this_00);
  return;
}

Assistant:

void CoalesceWalker::DoCoalesce(Regexp** r1ptr, Regexp** r2ptr) {
  Regexp* r1 = *r1ptr;
  Regexp* r2 = *r2ptr;

  Regexp* nre = Regexp::Repeat(
      r1->sub()[0]->Incref(), r1->parse_flags(), 0, 0);

  switch (r1->op()) {
    case kRegexpStar:
      nre->arguments.repeat.min_ = 0;
      nre->arguments.repeat.max_ = -1;
      break;

    case kRegexpPlus:
      nre->arguments.repeat.min_ = 1;
      nre->arguments.repeat.max_ = -1;
      break;

    case kRegexpQuest:
      nre->arguments.repeat.min_ = 0;
      nre->arguments.repeat.max_ = 1;
      break;

    case kRegexpRepeat:
      nre->arguments.repeat.min_ = r1->min();
      nre->arguments.repeat.max_ = r1->max();
      break;

    default:
      nre->Decref();
      LOG(DFATAL) << "DoCoalesce failed: r1->op() is " << r1->op();
      return;
  }

  switch (r2->op()) {
    case kRegexpStar:
      nre->arguments.repeat.max_ = -1;
      goto LeaveEmpty;

    case kRegexpPlus:
      nre->arguments.repeat.min_++;
      nre->arguments.repeat.max_ = -1;
      goto LeaveEmpty;

    case kRegexpQuest:
      if (nre->max() != -1)
        nre->arguments.repeat.max_++;
      goto LeaveEmpty;

    case kRegexpRepeat:
      nre->arguments.repeat.min_ += r2->min();
      if (r2->max() == -1)
        nre->arguments.repeat.max_ = -1;
      else if (nre->max() != -1)
        nre->arguments.repeat.max_ += r2->max();
      goto LeaveEmpty;

    case kRegexpLiteral:
    case kRegexpCharClass:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
      nre->arguments.repeat.min_++;
      if (nre->max() != -1)
        nre->arguments.repeat.max_++;
      goto LeaveEmpty;

    LeaveEmpty:
      *r1ptr = new Regexp(kRegexpEmptyMatch, Regexp::NoParseFlags);
      *r2ptr = nre;
      break;

    case kRegexpLiteralString: {
      Rune r = r1->sub()[0]->rune();
      // Determine how much of the literal string is removed.
      // We know that we have at least one rune. :)
      int n = 1;
      while (n < r2->nrunes() && r2->runes()[n] == r)
        n++;
      nre->arguments.repeat.min_ += n;
      if (nre->max() != -1)
        nre->arguments.repeat.max_ += n;
      if (n == r2->nrunes())
        goto LeaveEmpty;
      *r1ptr = nre;
      *r2ptr = Regexp::LiteralString(
          &r2->runes()[n], r2->nrunes() - n, r2->parse_flags());
      break;
    }

    default:
      nre->Decref();
      LOG(DFATAL) << "DoCoalesce failed: r2->op() is " << r2->op();
      return;
  }

  r1->Decref();
  r2->Decref();
}